

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  FORM *form;
  pointer ppfVar1;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> _Var2;
  vector<fieldnode*,std::allocator<fieldnode*>> *pvVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  cmValue cVar7;
  size_type __n;
  pointer pcVar8;
  cmCursesCacheEntryComposite *entry;
  allocator<char> local_82;
  allocator<char> local_81;
  vector<fieldnode*,std::allocator<fieldnode*>> *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form(form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  ppfVar1 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppfVar1) {
    (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppfVar1;
  }
  if (this->AdvancedMode == true) {
    sVar5 = (long)(this->Entries).
                  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->Entries).
                  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    this->NumberOfVisibleEntries = sVar5;
  }
  else {
    this->NumberOfVisibleEntries = 0;
    local_78 = (this->Entries).
               super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (pcVar8 = (this->Entries).
                  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                  ._M_impl.super__Vector_impl_data._M_start; pcVar8 != local_78; pcVar8 = pcVar8 + 1
        ) {
      _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
      super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
           (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,pcVar6,(allocator<char> *)&local_50);
      cVar7 = cmState::GetCacheEntryValue
                        ((cmState *)
                         _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
      super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
           (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar6,&local_81);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"ADVANCED",&local_82);
      bVar4 = cmState::GetCacheEntryPropertyAsBool
                        ((cmState *)
                         _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if ((cVar7.Value != (string *)0x0) && ((!bVar4 || (this->AdvancedMode != false)))) {
        this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
      }
    }
    sVar5 = this->NumberOfVisibleEntries;
  }
  local_80 = (vector<fieldnode*,std::allocator<fieldnode*>> *)&this->Fields;
  if (sVar5 == 0) {
    this->NumberOfVisibleEntries = 1;
    __n = 4;
  }
  else {
    __n = sVar5 * 3 + 1;
  }
  std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::reserve
            ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)local_80,__n);
  local_78 = (this->Entries).
             super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (pcVar8 = (this->Entries).
                super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar3 = local_80, pcVar8 != local_78;
      pcVar8 = pcVar8 + 1) {
    _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
    super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
         (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t
           .super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
    pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,pcVar6,(allocator<char> *)&local_50);
    cVar7 = cmState::GetCacheEntryValue
                      ((cmState *)
                       _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
    super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
         (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t
           .super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
    pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar6,&local_81);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"ADVANCED",&local_82);
    bVar4 = cmState::GetCacheEntryPropertyAsBool
                      ((cmState *)
                       _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    pvVar3 = local_80;
    if ((cVar7.Value != (string *)0x0) && ((!bVar4 || (this->AdvancedMode != false)))) {
      std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
                ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)local_80,
                 (FIELD **)
                 ((long)&((pcVar8->Label)._M_t.
                          super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                          .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl)->
                         super_cmCursesWidget + 0x30));
      std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
                ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)pvVar3,
                 &(((pcVar8->IsNewLabel)._M_t.
                    super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                    .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl)->
                  super_cmCursesWidget).Field);
      std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
                ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)pvVar3,
                 &((pcVar8->Entry)._M_t.
                   super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
                   super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
                   super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl)->Field);
    }
  }
  bVar4 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
          super__Vector_impl_data._M_finish;
  this->IsEmpty = bVar4;
  if (bVar4) {
    std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
              ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)local_80,
               (value_type *)
               ((long)(((this->EmptyCacheEntry)._M_t.
                        super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                        .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                      Label)._M_t + 0x30));
    std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
              ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)pvVar3,
               (value_type *)
               ((long)(((this->EmptyCacheEntry)._M_t.
                        super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                        .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                      IsNewLabel)._M_t.
                      super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
               + 0x30));
    std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
              ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)pvVar3,
               (value_type *)
               ((long)(((this->EmptyCacheEntry)._M_t.
                        super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                        .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                      Entry)._M_t.
                      super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_> +
               0x30));
    this->NumberOfVisibleEntries = 1;
  }
  local_70._M_dataplus._M_p = (pointer)0x0;
  std::vector<fieldnode*,std::allocator<fieldnode*>>::emplace_back<fieldnode*>
            (local_80,(fieldnode **)&local_70);
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }
  this->Fields.clear();
  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries.size();
  } else {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }
  // there is always one even if it is the dummy one
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields.reserve(3 * this->NumberOfVisibleEntries + 1);

  // Assign fields
  for (cmCursesCacheEntryComposite& entry : this->Entries) {
    cmValue existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
    bool advanced =
      this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
        entry.GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced)) {
      continue;
    }
    this->Fields.push_back(entry.Label->Field);
    this->Fields.push_back(entry.IsNewLabel->Field);
    this->Fields.push_back(entry.Entry->Field);
  }
  // if no cache entries there should still be one dummy field
  this->IsEmpty = this->Fields.empty();
  if (this->IsEmpty) {
    this->Fields.push_back(this->EmptyCacheEntry->Label->Field);
    this->Fields.push_back(this->EmptyCacheEntry->IsNewLabel->Field);
    this->Fields.push_back(this->EmptyCacheEntry->Entry->Field);
    this->NumberOfVisibleEntries = 1;
  }
  // Has to be null terminated.
  this->Fields.push_back(nullptr);
}